

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O0

void __thiscall
testloop_handlers::Input_Event_Notify
          (testloop_handlers *this,Am_Drawonable *param_1,Am_Input_Event *ev)

{
  Am_Input_Event *pAVar1;
  bool bVar2;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  Am_Input_Event *local_20;
  Am_Input_Event *ev_local;
  Am_Drawonable *param_2_local;
  testloop_handlers *this_local;
  
  local_20 = ev;
  ev_local = (Am_Input_Event *)param_1;
  param_2_local = (Am_Drawonable *)this;
  Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_24,"LEFT_DOWN",true);
  bVar2 = Am_Input_Char::operator==(&ev->input_char,local_24);
  pAVar1 = local_20;
  if (bVar2) {
    test_reparent1();
  }
  else {
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_28,"MIDDLE_DOWN",true);
    bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_28);
    pAVar1 = local_20;
    if (bVar2) {
      (**(code **)(*(long *)d2 + 0x50))(d2,0);
    }
    else {
      Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_2c,"RIGHT_DOWN",true);
      bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_2c);
      if (bVar2) {
        Input_Event_Notify::visible = (Input_Event_Notify::visible & 1U) != 1;
        (**(code **)(*(long *)d2 + 0x70))(d2,Input_Event_Notify::visible);
      }
    }
  }
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *, Am_Input_Event *ev) override
  {
    if (ev->input_char == "LEFT_DOWN")
      test_reparent1();
    else if (ev->input_char == "MIDDLE_DOWN")
      d2->Set_Position(0, 0);
    else if (ev->input_char == "RIGHT_DOWN") {
      static bool visible = true;
      if (visible == true)
        visible = false;
      else
        visible = true;
      d2->Set_Visible(visible);
    }
  }